

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

void SetPlane(uint8_t *dst_y,int dst_stride_y,int width,int height,uint32_t value)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  code *pcVar5;
  bool bVar6;
  
  iVar2 = height;
  if (height < 0) {
    iVar2 = -height;
    dst_y = dst_y + ~height * dst_stride_y;
    dst_stride_y = -dst_stride_y;
  }
  iVar4 = 0;
  if (dst_stride_y != width) {
    iVar4 = dst_stride_y;
  }
  iVar3 = iVar2;
  iVar1 = 1;
  if (dst_stride_y == width) {
    iVar3 = 1;
    iVar1 = iVar2;
  }
  iVar2 = libyuv::TestCpuFlag(0x10);
  if ((iVar1 * width & 3U) == 0) {
    pcVar5 = SetRow_X86;
  }
  else {
    pcVar5 = SetRow_Any_X86;
  }
  if (iVar2 == 0) {
    pcVar5 = SetRow_C;
  }
  iVar2 = libyuv::TestCpuFlag(0x800);
  if (iVar2 != 0) {
    pcVar5 = SetRow_ERMS;
  }
  while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
    (*pcVar5)(dst_y,value & 0xff,iVar1 * width);
    dst_y = dst_y + iVar4;
  }
  return;
}

Assistant:

LIBYUV_API
void SetPlane(uint8_t* dst_y,
              int dst_stride_y,
              int width,
              int height,
              uint32_t value) {
  int y;
  void (*SetRow)(uint8_t * dst, uint8_t value, int width) = SetRow_C;
  if (height < 0) {
    height = -height;
    dst_y = dst_y + (height - 1) * dst_stride_y;
    dst_stride_y = -dst_stride_y;
  }
  // Coalesce rows.
  if (dst_stride_y == width) {
    width *= height;
    height = 1;
    dst_stride_y = 0;
  }
#if defined(HAS_SETROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SetRow = SetRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      SetRow = SetRow_NEON;
    }
  }
#endif
#if defined(HAS_SETROW_X86)
  if (TestCpuFlag(kCpuHasX86)) {
    SetRow = SetRow_Any_X86;
    if (IS_ALIGNED(width, 4)) {
      SetRow = SetRow_X86;
    }
  }
#endif
#if defined(HAS_SETROW_ERMS)
  if (TestCpuFlag(kCpuHasERMS)) {
    SetRow = SetRow_ERMS;
  }
#endif
#if defined(HAS_SETROW_MSA)
  if (TestCpuFlag(kCpuHasMSA) && IS_ALIGNED(width, 16)) {
    SetRow = SetRow_MSA;
  }
#endif

  // Set plane
  for (y = 0; y < height; ++y) {
    SetRow(dst_y, value, width);
    dst_y += dst_stride_y;
  }
}